

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.hpp
# Opt level: O0

int __thiscall xercesc_4_0::Match::getStartPos(Match *this,int index)

{
  RuntimeException *this_00;
  ArrayIndexOutOfBoundsException *this_01;
  int index_local;
  Match *this_local;
  
  if (*(long *)(this + 0x10) == 0) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/Match.hpp"
               ,0x75,Regex_Result_Not_Set,*(MemoryManager **)(this + 0x20));
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  if ((-1 < index) && (index < *(int *)(this + 8))) {
    return *(int *)(*(long *)(this + 0x10) + (long)index * 4);
  }
  this_01 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/Match.hpp"
             ,0x78,Array_BadIndex,*(MemoryManager **)(this + 0x20));
  __cxa_throw(this_01,&ArrayIndexOutOfBoundsException::typeinfo,
              ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
}

Assistant:

inline int Match::getStartPos(int index) const {

    if (!fStartPositions)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Regex_Result_Not_Set, fMemoryManager);

    if (index < 0 || fNoGroups <= index)
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Array_BadIndex, fMemoryManager);

    return fStartPositions[index];
}